

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

CNode * __thiscall CConnman::FindNode(CConnman *this,CService *addr)

{
  pointer ppCVar1;
  bool bVar2;
  pointer ppCVar3;
  CNode *pCVar4;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock25;
  unique_lock<std::recursive_mutex> local_70;
  direct_or_indirect local_60;
  uint local_50;
  undefined8 local_48;
  uint16_t local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_70._M_device = &(this->m_nodes_mutex).super_recursive_mutex;
  local_70._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_70);
  ppCVar3 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppCVar1 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar3 != ppCVar1) {
    do {
      pCVar4 = *ppCVar3;
      prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_60.indirect_contents,
                 (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&pCVar4->addr);
      local_48._0_4_ = (pCVar4->addr).super_CService.super_CNetAddr.m_net;
      local_48._4_4_ = (pCVar4->addr).super_CService.super_CNetAddr.m_scope_id;
      local_40 = (pCVar4->addr).super_CService.port;
      bVar2 = ::operator==((CService *)&local_60.indirect_contents,addr);
      if (0x10 < local_50) {
        free(local_60.indirect_contents.indirect);
        local_60.indirect_contents.indirect = (char *)0x0;
      }
      if (bVar2) goto LAB_0019e56d;
      ppCVar3 = ppCVar3 + 1;
    } while (ppCVar3 != ppCVar1);
  }
  pCVar4 = (CNode *)0x0;
LAB_0019e56d:
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_70);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pCVar4;
  }
  __stack_chk_fail();
}

Assistant:

CNode* CConnman::FindNode(const CService& addr)
{
    LOCK(m_nodes_mutex);
    for (CNode* pnode : m_nodes) {
        if (static_cast<CService>(pnode->addr) == addr) {
            return pnode;
        }
    }
    return nullptr;
}